

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall IceMaths::Matrix4x4::Invert(Matrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar17 = Determinant(this);
  if (1e-07 <= ABS(fVar17)) {
    fVar17 = 1.0 / fVar17;
    fVar1 = this->m[1][1];
    fVar2 = this->m[2][2];
    fVar3 = this->m[3][3];
    fVar4 = this->m[1][2];
    fVar5 = this->m[2][3];
    fVar6 = this->m[3][1];
    fVar7 = this->m[1][3];
    fVar8 = this->m[2][1];
    fVar9 = this->m[3][2];
    fVar10 = this->m[2][0];
    fVar11 = this->m[3][0];
    fVar12 = this->m[1][0];
    fVar13 = this->m[0][1];
    fVar14 = this->m[0][3];
    fVar15 = this->m[0][2];
    fVar16 = this->m[0][0];
    this->m[0][0] =
         ((fVar7 * fVar8 * fVar9 + fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6) -
         (fVar3 * fVar8 * fVar4 + fVar2 * fVar6 * fVar7 + fVar1 * fVar5 * fVar9)) * fVar17;
    this->m[0][1] =
         -((fVar5 * fVar6 * fVar15 + fVar8 * fVar9 * fVar14 + fVar2 * fVar3 * fVar13) -
          (fVar6 * fVar14 * fVar2 + fVar9 * fVar13 * fVar5 + fVar8 * fVar3 * fVar15)) * fVar17;
    this->m[0][2] =
         ((fVar3 * fVar13 * fVar4 + fVar6 * fVar15 * fVar7 + fVar1 * fVar9 * fVar14) -
         (fVar7 * fVar13 * fVar9 + fVar1 * fVar15 * fVar3 + fVar6 * fVar4 * fVar14)) * fVar17;
    this->m[0][3] =
         -((fVar1 * fVar14 * fVar2 + fVar4 * fVar13 * fVar5 + fVar8 * fVar7 * fVar15) -
          (fVar1 * fVar5 * fVar15 + fVar4 * fVar8 * fVar14 + fVar2 * fVar7 * fVar13)) * fVar17;
    this->m[1][0] =
         -((fVar2 * fVar12 * fVar3 + fVar4 * fVar5 * fVar11 + fVar9 * fVar7 * fVar10) -
          (fVar2 * fVar11 * fVar7 + fVar5 * fVar9 * fVar12 + fVar4 * fVar3 * fVar10)) * fVar17;
    this->m[1][1] =
         ((fVar9 * fVar10 * fVar14 + fVar2 * fVar3 * fVar16 + fVar5 * fVar11 * fVar15) -
         (fVar9 * fVar16 * fVar5 + fVar3 * fVar15 * fVar10 + fVar2 * fVar11 * fVar14)) * fVar17;
    this->m[1][2] =
         -((fVar11 * fVar15 * fVar7 + fVar9 * fVar14 * fVar12 + fVar4 * fVar3 * fVar16) -
          (fVar12 * fVar15 * fVar3 + fVar4 * fVar14 * fVar11 + fVar9 * fVar7 * fVar16)) * fVar17;
    this->m[1][3] =
         ((fVar4 * fVar16 * fVar5 + fVar7 * fVar15 * fVar10 + fVar2 * fVar12 * fVar14) -
         (fVar4 * fVar10 * fVar14 + fVar2 * fVar7 * fVar16 + fVar5 * fVar12 * fVar15)) * fVar17;
    this->m[2][0] =
         ((fVar1 * fVar5 * fVar11 + fVar7 * fVar10 * fVar6 + fVar3 * fVar8 * fVar12) -
         (fVar5 * fVar6 * fVar12 + fVar3 * fVar10 * fVar1 + fVar7 * fVar8 * fVar11)) * fVar17;
    this->m[2][1] =
         -((fVar3 * fVar8 * fVar16 + fVar5 * fVar11 * fVar13 + fVar6 * fVar10 * fVar14) -
          (fVar3 * fVar13 * fVar10 + fVar11 * fVar14 * fVar8 + fVar5 * fVar6 * fVar16)) * fVar17;
    this->m[2][2] =
         ((fVar6 * fVar14 * fVar12 + fVar3 * fVar16 * fVar1 + fVar7 * fVar11 * fVar13) -
         (fVar1 * fVar14 * fVar11 + fVar7 * fVar16 * fVar6 + fVar3 * fVar12 * fVar13)) * fVar17;
    this->m[2][3] =
         -((fVar7 * fVar13 * fVar10 + fVar12 * fVar14 * fVar8 + fVar5 * fVar1 * fVar16) -
          (fVar7 * fVar8 * fVar16 + fVar5 * fVar12 * fVar13 + fVar14 * fVar1 * fVar10)) * fVar17;
    this->m[3][0] =
         -((fVar4 * fVar10 * fVar6 + fVar8 * fVar12 * fVar9 + fVar1 * fVar2 * fVar11) -
          (fVar9 * fVar10 * fVar1 + fVar8 * fVar11 * fVar4 + fVar2 * fVar6 * fVar12)) * fVar17;
    this->m[3][1] =
         ((fVar2 * fVar11 * fVar13 + fVar6 * fVar10 * fVar15 + fVar8 * fVar9 * fVar16) -
         (fVar11 * fVar15 * fVar8 + fVar6 * fVar16 * fVar2 + fVar9 * fVar13 * fVar10)) * fVar17;
    this->m[3][2] =
         -((fVar9 * fVar16 * fVar1 + fVar11 * fVar13 * fVar4 + fVar6 * fVar15 * fVar12) -
          (fVar6 * fVar4 * fVar16 + fVar12 * fVar13 * fVar9 + fVar1 * fVar15 * fVar11)) * fVar17;
    this->m[3][3] =
         ((fVar12 * fVar15 * fVar8 + fVar1 * fVar16 * fVar2 + fVar4 * fVar13 * fVar10) -
         (fVar2 * fVar12 * fVar13 + fVar1 * fVar10 * fVar15 + fVar4 * fVar8 * fVar16)) * fVar17;
  }
  return this;
}

Assistant:

Matrix4x4& Matrix4x4::Invert()
{
	float Det = Determinant();
	Matrix4x4 Temp;

	if(fabsf(Det) < MATRIX4X4_EPSILON)
		return	*this;		// The matrix is not invertible! Singular case!

	float IDet = 1.0f / Det;

	Temp.m[0][0] = CoFactor(0,0) * IDet;
	Temp.m[1][0] = CoFactor(0,1) * IDet;
	Temp.m[2][0] = CoFactor(0,2) * IDet;
	Temp.m[3][0] = CoFactor(0,3) * IDet;
	Temp.m[0][1] = CoFactor(1,0) * IDet;
	Temp.m[1][1] = CoFactor(1,1) * IDet;
	Temp.m[2][1] = CoFactor(1,2) * IDet;
	Temp.m[3][1] = CoFactor(1,3) * IDet;
	Temp.m[0][2] = CoFactor(2,0) * IDet;
	Temp.m[1][2] = CoFactor(2,1) * IDet;
	Temp.m[2][2] = CoFactor(2,2) * IDet;
	Temp.m[3][2] = CoFactor(2,3) * IDet;
	Temp.m[0][3] = CoFactor(3,0) * IDet;
	Temp.m[1][3] = CoFactor(3,1) * IDet;
	Temp.m[2][3] = CoFactor(3,2) * IDet;
	Temp.m[3][3] = CoFactor(3,3) * IDet;

	*this = Temp;

	return	*this;
}